

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O3

int OBJ_obj2nid(ASN1_OBJECT *o)

{
  ASN1_OBJECT *pAVar1;
  ushort *puVar2;
  
  if (o == (ASN1_OBJECT *)0x0) {
    return 0;
  }
  if (o->nid != 0) {
    return o->nid;
  }
  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if ((global_added_by_data == (lhash_st_ASN1_OBJECT *)0x0) ||
     (pAVar1 = (ASN1_OBJECT *)
               OPENSSL_lh_retrieve((_LHASH *)global_added_by_data,o,lh_ASN1_OBJECT_call_hash_func,
                                   lh_ASN1_OBJECT_call_cmp_func), pAVar1 == (ASN1_OBJECT *)0x0)) {
    CRYPTO_MUTEX_unlock_read(&global_added_lock);
    puVar2 = (ushort *)bsearch(o,kNIDsInOIDOrder,0x371,2,obj_cmp);
    if (puVar2 == (ushort *)0x0) {
      return 0;
    }
    if (0x3c4 < *puVar2 - 1) {
      abort();
    }
    pAVar1 = kObjects + (*puVar2 - 1);
  }
  else {
    CRYPTO_MUTEX_unlock_read(&global_added_lock);
  }
  return pAVar1->nid;
}

Assistant:

int OBJ_obj2nid(const ASN1_OBJECT *obj) {
  if (obj == NULL) {
    return NID_undef;
  }

  if (obj->nid != 0) {
    return obj->nid;
  }

  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_data != NULL) {
    ASN1_OBJECT *match;

    match = lh_ASN1_OBJECT_retrieve(global_added_by_data, obj);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match->nid;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

  const uint16_t *nid_ptr = reinterpret_cast<const uint16_t *>(
      bsearch(obj, kNIDsInOIDOrder, OPENSSL_ARRAY_SIZE(kNIDsInOIDOrder),
              sizeof(kNIDsInOIDOrder[0]), obj_cmp));
  if (nid_ptr == NULL) {
    return NID_undef;
  }

  return get_builtin_object(*nid_ptr)->nid;
}